

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::AboveMaximum(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
               *this,uint64_t actual,SValue *expected,bool exclusive)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *actual_00;
  code *exclusive_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_38;
  byte local_21;
  SValue *pSStack_20;
  bool exclusive_local;
  SValue *expected_local;
  uint64_t actual_local;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *this_local;
  
  local_21 = exclusive;
  pSStack_20 = expected;
  expected_local = (SValue *)actual;
  actual_local = (uint64_t)this;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue(&local_38,actual);
  actual_00 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Move(&local_38);
  exclusive_00 = (_func_ValueType_ptr *)0x0;
  if ((local_21 & 1) != 0) {
    exclusive_00 = internal::
                   Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
                   ::GetExclusiveMaximumString;
  }
  AddNumberError(this,(uint)exclusive & kValidateErrorMultipleOf | kValidateErrorMaximum,actual_00,
                 pSStack_20,exclusive_00);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&local_38);
  return;
}

Assistant:

void AboveMaximum(uint64_t actual, const SValue& expected, bool exclusive) {
        AddNumberError(exclusive ? kValidateErrorExclusiveMaximum : kValidateErrorMaximum, ValueType(actual).Move(), expected,
            exclusive ? &SchemaType::GetExclusiveMaximumString : 0);
    }